

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineColorBlendStateCreateInfo *state)

{
  uint uVar1;
  VkPipelineColorBlendAttachmentState *__first;
  reference pvVar2;
  allocator<vk::VkPipelineColorBlendAttachmentState> local_31;
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  local_30;
  VkPipelineColorBlendStateCreateInfo *local_18;
  VkPipelineColorBlendStateCreateInfo *state_local;
  PipelineCreateInfo *this_local;
  
  __first = state->pAttachments;
  uVar1 = state->attachmentCount;
  local_18 = state;
  state_local = (VkPipelineColorBlendStateCreateInfo *)this;
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::allocator(&local_31);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&local_30,__first,__first + uVar1,&local_31);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::operator=(&this->m_colorBlendStateAttachments,&local_30);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~vector(&local_30);
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::~allocator(&local_31);
  memcpy(&this->m_colorBlendState,local_18,0x38);
  pvVar2 = std::
           vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ::operator[](&this->m_colorBlendStateAttachments,0);
  (this->m_colorBlendState).pAttachments = pvVar2;
  (this->super_VkGraphicsPipelineCreateInfo).pColorBlendState = &this->m_colorBlendState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineColorBlendStateCreateInfo& state)
{
	m_colorBlendStateAttachments	= std::vector<vk::VkPipelineColorBlendAttachmentState>(state.pAttachments, state.pAttachments + state.attachmentCount);
	m_colorBlendState				= state;
	m_colorBlendState.pAttachments	= &m_colorBlendStateAttachments[0];
	pColorBlendState				= &m_colorBlendState;

	return *this;
}